

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

void __thiscall wirehair::Codec::CopyDeferredRows(Codec *this)

{
  ushort uVar1;
  uint64_t *__dest;
  uint uVar2;
  
  uVar1 = this->_defer_head_rows;
  if (uVar1 != 0xffff) {
    uVar2 = (uint)this->_dense_count;
    __dest = this->_ge_matrix + uVar2 * this->_ge_pitch;
    do {
      memcpy(__dest,this->_compress_matrix + this->_ge_pitch * (uint)uVar1,
             (ulong)this->_ge_pitch << 3);
      this->_ge_row_map[uVar2 & 0xffff] = uVar1;
      uVar2 = uVar2 + 1;
      __dest = __dest + this->_ge_pitch;
      uVar1 = this->_peel_rows[uVar1].NextRow;
    } while (uVar1 != 0xffff);
  }
  return;
}

Assistant:

void Codec::CopyDeferredRows()
{
    CAT_IF_DUMP(cout << endl << "---- CopyDeferredRows ----" << endl << endl;)

    // Get GE matrix row starting at dense rows
    uint64_t * GF256_RESTRICT ge_row = _ge_matrix + _ge_pitch * _dense_count;

    // For each deferred row:
    for (uint16_t ge_row_i = _dense_count, defer_row_i = _defer_head_rows;
        defer_row_i != LIST_TERM;
        ++ge_row_i, ge_row += _ge_pitch)
    {
        CAT_IF_DUMP(cout << "Peeled row " << defer_row_i << " for GE row " << ge_row_i << endl;)

        // Get Compress matrix row
        uint64_t * GF256_RESTRICT compress_row = _compress_matrix + _ge_pitch * defer_row_i;

        // Copy Compress row to GE row
        memcpy(ge_row, compress_row, _ge_pitch * sizeof(uint64_t));

        // Set row map for this deferred row
        _ge_row_map[ge_row_i] = defer_row_i;

        // Get next deferred row from peeling solver output
        defer_row_i = _peel_rows[defer_row_i].NextRow;
    }
}